

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *
CoreML::shapeRangesOf
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,ArrayFeatureType *params)

{
  int iVar1;
  int iVar2;
  ArrayFeatureType_ShapeRange *pAVar3;
  SizeRange *pSVar4;
  pair<long,_long> pVar5;
  int64 local_50;
  uint64 local_48;
  pair<long,_long> local_40 [2];
  int local_20;
  undefined1 local_19;
  int i;
  ArrayFeatureType *params_local;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *ranges;
  
  local_19 = 0;
  _i = params;
  params_local = (ArrayFeatureType *)__return_storage_ptr__;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (__return_storage_ptr__);
  local_20 = 0;
  while( true ) {
    iVar1 = local_20;
    pAVar3 = Specification::ArrayFeatureType::shaperange(_i);
    iVar2 = Specification::ArrayFeatureType_ShapeRange::sizeranges_size(pAVar3);
    if (iVar2 <= iVar1) break;
    pAVar3 = Specification::ArrayFeatureType::shaperange(_i);
    pSVar4 = Specification::ArrayFeatureType_ShapeRange::sizeranges(pAVar3,local_20);
    local_48 = Specification::SizeRange::lowerbound(pSVar4);
    pAVar3 = Specification::ArrayFeatureType::shaperange(_i);
    pSVar4 = Specification::ArrayFeatureType_ShapeRange::sizeranges(pAVar3,local_20);
    local_50 = Specification::SizeRange::upperbound(pSVar4);
    pVar5 = std::make_pair<long,long>((long *)&local_48,&local_50);
    local_40[0] = pVar5;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
              (__return_storage_ptr__,local_40);
    local_20 = local_20 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::pair<int64_t,int64_t>> shapeRangesOf(const Specification::ArrayFeatureType &params) {
        std::vector<std::pair<int64_t,int64_t>> ranges;
        for (int i=0; i<params.shaperange().sizeranges_size(); i++) {
            ranges.push_back(std::make_pair((int64_t)params.shaperange().sizeranges(i).lowerbound(),
                                            (int64_t)params.shaperange().sizeranges(i).upperbound()));
        }
        return ranges;
    }